

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O2

void __thiscall
ImportSource_addImportSourceBadInput_Test::TestBody(ImportSource_addImportSourceBadInput_Test *this)

{
  byte bVar1;
  AssertHelper aAStack_68 [8];
  Message local_60 [8];
  AssertionResult local_58 [2];
  ImporterPtr importer;
  AssertionResult gtest_ar_;
  
  libcellml::Importer::create(SUB81(&importer,0));
  local_58[0]._0_8_ = (char *)0x0;
  local_58[0].message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = libcellml::Importer::addImportSource
                    ((shared_ptr *)
                     importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58[0].message_);
  if (bVar1 != 0) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_58,&gtest_ar_.success_,"importer->addImportSource(nullptr)","true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x21,(char *)local_58[0]._0_8_);
    testing::internal::AssertHelper::operator=(aAStack_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(ImportSource, addImportSourceBadInput)
{
    auto importer = libcellml::Importer::create();

    EXPECT_FALSE(importer->addImportSource(nullptr));
}